

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O0

void __thiscall
Assimp::ValidateDSProcess::DoValidationWithNameCheck<aiCamera>
          (ValidateDSProcess *this,aiCamera **array,uint size,char *firstName,char *secondName)

{
  aiCamera *paVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  allocator local_91;
  string local_90 [8];
  string name_1;
  allocator local_59;
  string local_58 [8];
  string name;
  int res;
  uint i;
  char *secondName_local;
  char *firstName_local;
  uint size_local;
  aiCamera **array_local;
  ValidateDSProcess *this_local;
  
  DoValidationEx<aiCamera>(this,array,size,firstName,secondName);
  name.field_2._12_4_ = 0;
  while( true ) {
    if (size <= (uint)name.field_2._12_4_) {
      return;
    }
    name.field_2._8_4_ =
         HasNameMatch(&array[(uint)name.field_2._12_4_]->mName,this->mScene->mRootNode);
    if (name.field_2._8_4_ == 0) break;
    if (name.field_2._8_4_ != 1) {
      paVar1 = array[(uint)name.field_2._12_4_];
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,(paVar1->mName).data,&local_91);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      uVar2 = name.field_2._12_4_;
      uVar3 = std::__cxx11::string::c_str();
      ReportError(this,"aiScene::%s[%i]: there are more than one nodes with %s as name",firstName,
                  (ulong)(uint)uVar2,uVar3);
    }
    name.field_2._12_4_ = name.field_2._12_4_ + 1;
    name.field_2._8_4_ = 1;
  }
  paVar1 = array[(uint)name.field_2._12_4_];
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,(paVar1->mName).data,&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  uVar2 = name.field_2._12_4_;
  uVar3 = std::__cxx11::string::c_str();
  ReportError(this,"aiScene::%s[%i] has no corresponding node in the scene graph (%s)",firstName,
              (ulong)(uint)uVar2,uVar3);
}

Assistant:

inline
void ValidateDSProcess::DoValidationWithNameCheck(T** array, unsigned int size, const char* firstName,
        const char* secondName) {
    // validate all entries
    DoValidationEx(array,size,firstName,secondName);

    for (unsigned int i = 0; i < size;++i) {
        int res = HasNameMatch(array[i]->mName,mScene->mRootNode);
        if (0 == res)   {
            const std::string name = static_cast<char*>(array[i]->mName.data);
            ReportError("aiScene::%s[%i] has no corresponding node in the scene graph (%s)",
                firstName,i, name.c_str());
        } else if (1 != res)  {
            const std::string name = static_cast<char*>(array[i]->mName.data);
            ReportError("aiScene::%s[%i]: there are more than one nodes with %s as name",
                firstName,i, name.c_str());
        }
    }
}